

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqmap.c
# Opt level: O3

void seqmap_free(seqmap_t *map)

{
  size_t sVar1;
  long lVar2;
  
  if (map != (seqmap_t *)0x0) {
    sVar1 = map->len;
    if (sVar1 != 0) {
      lVar2 = sVar1 * 0x10 + -8;
      do {
        if ((*(byte *)((long)map->ptr + lVar2 + -4) & 1) != 0) {
          free(*(void **)((long)&map->ptr->key + lVar2));
        }
        lVar2 = lVar2 + -0x10;
        sVar1 = sVar1 - 1;
      } while (sVar1 != 0);
    }
    free(map->ptr);
    free(map);
    return;
  }
  return;
}

Assistant:

void
seqmap_free(
    seqmap_t *map)
{
    if (!map)
        return;
    seqmap_entry_t *ent;
    seqmap_for_each(map, ent)
        if (ent->flags & SEQMAP_FLAG_ALLOC)
            free(ent->value);
    free(map->ptr);
    free(map);
}